

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

errr grab_int_range(int *lo,int *hi,char *range,char *sep)

{
  _Bool _Var1;
  long lVar2;
  ushort **ppuVar3;
  size_t sVar4;
  long lVar5;
  size_t nonwhite_offset;
  long lv2;
  long lv1;
  char *pe;
  char *sep_local;
  char *range_local;
  int *hi_local;
  int *lo_local;
  
  pe = sep;
  sep_local = range;
  range_local = (char *)hi;
  hi_local = lo;
  lVar2 = strtol(range,(char **)&lv1,10);
  if (((((char *)lv1 == sep_local) ||
       (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*(char *)lv1] & 0x2000) == 0)) ||
      (lVar2 < -0x7fffffff)) || (0x7ffffffe < lVar2)) {
    return 0x25;
  }
  sep_local = (char *)lv1;
  if (pe != (char *)0x0) {
    lv1 = (long)strstr((char *)lv1,pe);
    if ((char *)lv1 == (char *)0x0) {
      return 0x25;
    }
    sVar4 = strspn(sep_local," \t");
    lVar5 = lv1;
    if (sep_local + sVar4 != (char *)lv1) {
      return 0x25;
    }
    sVar4 = strlen(pe);
    sep_local = (char *)(lVar5 + sVar4);
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)*sep_local] & 0x2000) == 0) {
      return 0x25;
    }
  }
  lVar5 = strtol(sep_local,(char **)&lv1,10);
  if ((((char *)lv1 == sep_local) || (_Var1 = contains_only_spaces((char *)lv1), !_Var1)) ||
     ((lVar5 < -0x7fffffff || (0x7ffffffe < lVar5)))) {
    lo_local._4_4_ = 0x25;
  }
  else {
    *hi_local = (int)lVar2;
    *(int *)range_local = (int)lVar5;
    lo_local._4_4_ = 0;
  }
  return lo_local._4_4_;
}

Assistant:

errr grab_int_range(int *lo, int *hi, const char *range, const char *sep)
{
	char *pe;
	long lv1 = strtol(range, &pe, 10), lv2;

	/*
	 * Reject INT_MIN and INT_MAX as well so don't have to check errno in
	 * order to recognize overflow when sizeof(int) == sizeof(long).
	 */
	if (pe == range || !isspace(*pe) || lv1 <= INT_MIN || lv1 >= INT_MAX) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	range = pe;
	if (sep) {
		size_t nonwhite_offset;

		pe = strstr(range, sep);
		if (!pe) {
			return PARSE_ERROR_INVALID_VALUE;
		}
		nonwhite_offset = strspn(range, " \t");
		if (range + nonwhite_offset != pe) {
			return PARSE_ERROR_INVALID_VALUE;
		}
		range = pe + strlen(sep);
		if (!isspace(*range)) {
			return PARSE_ERROR_INVALID_VALUE;
		}
	}
	lv2 = strtol(range, &pe, 10);
	if (pe == range || !contains_only_spaces(pe) || lv2 <= INT_MIN
			|| lv2 >= INT_MAX) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	*lo = (int)lv1;
	*hi = (int)lv2;
	return PARSE_ERROR_NONE;
}